

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh_tests.cpp
# Opt level: O1

void test<char_const*const*&>(int argc,char ***argv)

{
  code *pcVar1;
  char extraout_AL;
  bool bVar2;
  char extraout_AL_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar3;
  ResultBuilder _DOCTEST_RB;
  parser cmdl;
  Result local_1a8;
  ResultBuilder local_188;
  unsigned_long local_110;
  Expression_lhs<int> local_108;
  parser local_100;
  
  argh::parser::parser(&local_100,argc,*argv,1);
  local_188.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_188.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_188.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_188.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_188.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x28);
  local_188.super_AssertData.m_at = DT_CHECK;
  local_188.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]argh/argh_tests.cpp";
  local_188.super_AssertData.m_line = 0x1c7;
  local_188.super_AssertData.m_expr = "5 == cmdl.pos_args().size()";
  local_188.super_AssertData.m_failed = true;
  local_188.super_AssertData.m_threw = false;
  local_188.super_AssertData.m_threw_as = false;
  local_188.super_AssertData.m_exception_type = "";
  local_188.super_AssertData.m_exception_string = "";
  local_108.lhs = 5;
  local_108.m_at = DT_CHECK;
  local_110 = (long)local_100.pos_args_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_100.pos_args_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  doctest::detail::Expression_lhs<int>::operator==(&local_1a8,&local_108,&local_110);
  doctest::String::operator=(&local_188.super_AssertData.m_decomp,&local_1a8.m_decomp);
  local_188.super_AssertData._40_2_ =
       CONCAT11(local_188.super_AssertData.m_threw,local_1a8.m_passed) ^ 1;
  dVar3 = extraout_XMM0_Qa;
  if ((local_1a8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_1a8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_1a8.m_decomp.field_0.data.ptr);
    dVar3 = extraout_XMM0_Qa_00;
  }
  doctest::detail::ResultBuilder::log(&local_188,dVar3);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if (local_188.super_AssertData.m_failed == true) {
    bVar2 = doctest::detail::checkIfShouldThrow(local_188.super_AssertData.m_at);
    if (bVar2) {
      doctest::detail::throwException();
    }
  }
  if ((local_188.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_188.super_AssertData.m_decomp.field_0._1_7_,
                       local_188.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_188.super_AssertData.m_decomp.field_0._1_7_,
                                       local_188.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_188.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_188.super_AssertData.m_exception.field_0._1_7_,
                       local_188.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_188.super_AssertData.m_exception.field_0._1_7_,
                                       local_188.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_188.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_188.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_188.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_188.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_188.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x28);
  local_188.super_AssertData.m_at = DT_CHECK;
  local_188.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]argh/argh_tests.cpp";
  local_188.super_AssertData.m_line = 0x1c8;
  local_188.super_AssertData.m_expr = "2 == cmdl.flags().size()";
  local_188.super_AssertData.m_failed = true;
  local_188.super_AssertData.m_threw = false;
  local_188.super_AssertData.m_threw_as = false;
  local_188.super_AssertData.m_exception_type = "";
  local_188.super_AssertData.m_exception_string = "";
  local_108.lhs = 2;
  local_108.m_at = DT_CHECK;
  local_110 = local_100.flags_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  doctest::detail::Expression_lhs<int>::operator==(&local_1a8,&local_108,&local_110);
  doctest::String::operator=(&local_188.super_AssertData.m_decomp,&local_1a8.m_decomp);
  local_188.super_AssertData._40_2_ =
       CONCAT11(local_188.super_AssertData.m_threw,local_1a8.m_passed) ^ 1;
  dVar3 = extraout_XMM0_Qa_01;
  if ((local_1a8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_1a8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_1a8.m_decomp.field_0.data.ptr);
    dVar3 = extraout_XMM0_Qa_02;
  }
  doctest::detail::ResultBuilder::log(&local_188,dVar3);
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if (local_188.super_AssertData.m_failed == true) {
    bVar2 = doctest::detail::checkIfShouldThrow(local_188.super_AssertData.m_at);
    if (bVar2) {
      doctest::detail::throwException();
    }
  }
  if ((local_188.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_188.super_AssertData.m_decomp.field_0._1_7_,
                       local_188.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_188.super_AssertData.m_decomp.field_0._1_7_,
                                       local_188.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_188.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_188.super_AssertData.m_exception.field_0._1_7_,
                       local_188.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_188.super_AssertData.m_exception.field_0._1_7_,
                                       local_188.super_AssertData.m_exception.field_0.buf[0]));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.empty_._M_dataplus._M_p != &local_100.empty_.field_2) {
    operator_delete(local_100.empty_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_100.registeredParams_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_100.flags_._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.pos_args_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_100.params_._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.args_);
  return;
}

Assistant:

void test(int argc, T&& argv)
{
   auto cmdl = parser(argc, argv);
   CHECK(5 == cmdl.pos_args().size());
   CHECK(2 == cmdl.flags().size());
}